

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_SimRsbTfo_rec(Gia_Man_t *p,int iObj,int iFanout,Vec_Int_t *vTfo)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,iObj);
  iVar1 = 0;
  while( true ) {
    iVar2 = Gia_ObjFanoutNumId(p,iObj);
    if (iVar2 <= iVar1) break;
    iVar2 = Gia_ObjFanoutId(p,iObj,iVar1);
    if (iVar2 == iFanout || iFanout == -1) {
      Gia_SimRsbTfo_rec(p,iVar2,-1,vTfo);
    }
    iVar1 = iVar1 + 1;
  }
  Vec_IntPush(vTfo,iObj);
  return;
}

Assistant:

void Gia_SimRsbTfo_rec( Gia_Man_t * p, int iObj, int iFanout, Vec_Int_t * vTfo )
{
    int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        if ( iFanout == -1 || iFan == iFanout )
            Gia_SimRsbTfo_rec( p, iFan, -1, vTfo );
    Vec_IntPush( vTfo, iObj );
}